

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O0

void test_bson_as_json_symbol(void)

{
  byte bVar1;
  int iVar2;
  undefined1 local_20 [8];
  size_t len;
  char *str;
  bson_t *b;
  
  str = (char *)bson_new();
  bVar1 = bson_append_symbol(str,"symbol",0xffffffff,"foo");
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x239,"test_bson_as_json_symbol","bson_append_symbol (b, \"symbol\", -1, \"foo\", -1)");
    abort();
  }
  bVar1 = bson_append_symbol(str,"escaping",0xffffffff,"\"bar\"");
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x23a,"test_bson_as_json_symbol",
            "bson_append_symbol (b, \"escaping\", -1, \"\\\"bar\\\"\", -1)");
    abort();
  }
  len = bson_as_json(str,local_20);
  if ((char *)len != "{ \"symbol\" : \"foo\", \"escaping\" : \"\\\"bar\\\"\" }") {
    iVar2 = strcmp((char *)len,"{ \"symbol\" : \"foo\", \"escaping\" : \"\\\"bar\\\"\" }");
    if (iVar2 != 0) {
      fprintf(_stderr,"FAIL\n\nAssert Failure: \"%s\" != \"%s\"\n",len,
              "{ \"symbol\" : \"foo\", \"escaping\" : \"\\\"bar\\\"\" }");
      abort();
    }
  }
  bson_free(len);
  bson_destroy(str);
  return;
}

Assistant:

static void
test_bson_as_json_symbol (void)
{
   bson_t *b;
   char *str;
   size_t len;

   b = bson_new ();
   BSON_ASSERT (bson_append_symbol (b, "symbol", -1, "foo", -1));
   BSON_ASSERT (bson_append_symbol (b, "escaping", -1, "\"bar\"", -1));
   str = bson_as_json (b, &len);

   ASSERT_CMPSTR (str,
                  "{"
                  " \"symbol\" : \"foo\","
                  " \"escaping\" : \"\\\"bar\\\"\" }");

   bson_free (str);
   bson_destroy (b);
}